

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O1

void tcg_expand_vec_op_riscv32
               (TCGContext_conflict9 *tcg_ctx,TCGOpcode opc,TCGType_conflict type,uint vece,
               TCGArg a0,...)

{
  ulong *puVar1;
  uint uVar2;
  long lVar3;
  _Bool _Var4;
  uint uVar5;
  TCGTemp *pTVar6;
  TCGTemp *pTVar7;
  TCGTemp *r;
  TCGTemp *b;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uintptr_t o_3;
  ulong uVar11;
  long lVar12;
  int line;
  TCGArg i;
  TCGArg in_R9;
  uintptr_t o_8;
  uintptr_t o_2;
  int64_t i_00;
  TCGv_vec pTVar13;
  TCGv_vec pTVar14;
  uintptr_t o_6;
  TCGv_vec pTVar15;
  ulong uVar16;
  TCGArg in_stack_00000008;
  TCGCond TStack0000000000000010;
  long in_stack_00000018;
  TCGCond in_stack_00000020;
  va_list va;
  uintptr_t o_1;
  uintptr_t o;
  
  if (0xb < opc - INDEX_op_shli_vec) {
    if (opc != INDEX_op_mul_vec) {
      return;
    }
    if (type - TCG_TYPE_V128 < 2) {
      pTVar6 = tcg_temp_new_internal_riscv32(tcg_ctx,type,false);
      pTVar14 = (TCGv_vec)((long)pTVar6 - (long)tcg_ctx);
      pTVar7 = tcg_temp_new_internal_riscv32(tcg_ctx,type,false);
      r = tcg_temp_new_internal_riscv32(tcg_ctx,type,false);
      pTVar13 = (TCGv_vec)((long)r - (long)tcg_ctx);
      b = tcg_temp_new_internal_riscv32(tcg_ctx,type,false);
      pTVar15 = (TCGv_vec)((long)b - (long)tcg_ctx);
      tcg_gen_dup16i_vec_riscv32(tcg_ctx,pTVar15,0);
      uVar8 = ((long)(pTVar14 + -0x388) >> 3) * 0x6db6db6db6db6db7;
      uVar9 = ((long)(pTVar15 + -0x388) >> 3) * 0x6db6db6db6db6db7;
      vec_gen_3_riscv32(tcg_ctx,INDEX_op_x86_punpckl_vec,type,0,(TCGArg)pTVar6,in_R9,(TCGArg)b);
      uVar10 = ((long)((TCGv_vec)((long)pTVar7 - (long)tcg_ctx) + -0x388) >> 3) * 0x6db6db6db6db6db7
      ;
      vec_gen_3_riscv32(tcg_ctx,INDEX_op_x86_punpckl_vec,type,0,(TCGArg)pTVar7,(TCGArg)b,
                        in_stack_00000008);
      uVar11 = ((long)(pTVar13 + -0x388) >> 3) * 0x6db6db6db6db6db7;
      vec_gen_3_riscv32(tcg_ctx,INDEX_op_x86_punpckh_vec,type,0,(TCGArg)r,in_R9,(TCGArg)b);
      vec_gen_3_riscv32(tcg_ctx,INDEX_op_x86_punpckh_vec,type,0,(TCGArg)b,(TCGArg)b,
                        in_stack_00000008);
      tcg_gen_mul_vec_riscv32(tcg_ctx,1,pTVar14,pTVar14,(TCGv_vec)((long)pTVar7 - (long)tcg_ctx));
      tcg_gen_mul_vec_riscv32(tcg_ctx,1,pTVar13,pTVar13,pTVar15);
      tcg_gen_shri_vec_riscv32(tcg_ctx,1,pTVar14,pTVar14,8);
      tcg_gen_shri_vec_riscv32(tcg_ctx,1,pTVar13,pTVar13,8);
      vec_gen_3_riscv32(tcg_ctx,INDEX_op_x86_packus_vec,type,0,a0,(TCGArg)pTVar6,(TCGArg)r);
      uVar16 = *(ulong *)pTVar6;
      *(ulong *)pTVar6 = uVar16 & 0xffffff5fffffffff;
      puVar1 = (ulong *)((long)tcg_ctx->free_temps[0].l +
                        (uVar8 >> 6) * 8 +
                        (ulong)((((uint)(uVar16 >> 0x26) & 1) * 5 + ((uint)(uVar16 >> 0x10) & 0xff))
                               * 0x40));
      *puVar1 = *puVar1 | 1L << ((byte)uVar8 & 0x3f);
      uVar16 = *(ulong *)pTVar7;
      *(ulong *)pTVar7 = uVar16 & 0xffffff5fffffffff;
      puVar1 = (ulong *)((long)tcg_ctx->free_temps[0].l +
                        (uVar10 >> 6) * 8 +
                        (ulong)((((uint)(uVar16 >> 0x26) & 1) * 5 + ((uint)(uVar16 >> 0x10) & 0xff))
                               * 0x40));
      *puVar1 = *puVar1 | 1L << ((byte)uVar10 & 0x3f);
      uVar16 = *(ulong *)r;
      *(ulong *)r = uVar16 & 0xffffff5fffffffff;
      puVar1 = (ulong *)((long)tcg_ctx->free_temps[0].l +
                        (uVar11 >> 6) * 8 +
                        (ulong)((((uint)(uVar16 >> 0x26) & 1) * 5 + ((uint)(uVar16 >> 0x10) & 0xff))
                               * 0x40));
      *puVar1 = *puVar1 | 1L << ((byte)uVar11 & 0x3f);
      uVar16 = *(ulong *)b;
      *(ulong *)b = uVar16 & 0xffffff5fffffffff;
      puVar1 = (ulong *)((long)tcg_ctx->free_temps[0].l +
                        (uVar9 >> 6) * 8 +
                        (ulong)((((uint)(uVar16 >> 0x26) & 1) * 5 + ((uint)(uVar16 >> 0x10) & 0xff))
                               * 0x40));
      *puVar1 = *puVar1 | 1L << ((byte)uVar9 & 0x3f);
      return;
    }
    if (type != TCG_TYPE_V64) {
      line = 0xd7e;
LAB_00c10c7a:
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
                 ,line,(char *)0x0);
    }
    pTVar6 = tcg_temp_new_internal_riscv32(tcg_ctx,TCG_TYPE_V128,false);
    pTVar15 = (TCGv_vec)((long)pTVar6 - (long)tcg_ctx);
    pTVar7 = tcg_temp_new_internal_riscv32(tcg_ctx,TCG_TYPE_V128,false);
    pTVar14 = (TCGv_vec)((long)pTVar7 - (long)tcg_ctx);
    tcg_gen_dup16i_vec_riscv32(tcg_ctx,pTVar14,0);
    uVar8 = ((long)(pTVar15 + -0x388) >> 3) * 0x6db6db6db6db6db7;
    vec_gen_3_riscv32(tcg_ctx,INDEX_op_x86_punpckl_vec,TCG_TYPE_V128,0,(TCGArg)pTVar6,in_R9,
                      (TCGArg)pTVar7);
    vec_gen_3_riscv32(tcg_ctx,INDEX_op_x86_punpckl_vec,TCG_TYPE_V128,0,(TCGArg)pTVar7,(TCGArg)pTVar7
                      ,in_stack_00000008);
    tcg_gen_mul_vec_riscv32(tcg_ctx,1,pTVar15,pTVar15,pTVar14);
    tcg_gen_shri_vec_riscv32(tcg_ctx,1,pTVar15,pTVar15,8);
    vec_gen_3_riscv32(tcg_ctx,INDEX_op_x86_packus_vec,TCG_TYPE_V128,0,a0,(TCGArg)pTVar6,
                      (TCGArg)pTVar6);
    uVar16 = *(ulong *)pTVar6;
    *(ulong *)pTVar6 = uVar16 & 0xffffff5fffffffff;
    puVar1 = (ulong *)((long)tcg_ctx->free_temps[0].l +
                      (uVar8 >> 6) * 8 +
                      (ulong)((((uint)(uVar16 >> 0x26) & 1) * 5 + ((uint)(uVar16 >> 0x10) & 0xff)) *
                             0x40));
    *puVar1 = *puVar1 | 1L << ((byte)uVar8 & 0x3f);
    uVar16 = *(ulong *)pTVar7;
    *(ulong *)pTVar7 = uVar16 & 0xffffff5fffffffff;
LAB_00c10c1f:
    uVar8 = ((long)(pTVar14 + -0x388) >> 3) * 0x6db6db6db6db6db7;
    puVar1 = (ulong *)((long)tcg_ctx->free_temps[0].l +
                      (uVar8 >> 6) * 8 +
                      (ulong)((((uint)(uVar16 >> 0x26) & 1) * 5 + ((uint)(uVar16 >> 0x10) & 0xff)) *
                             0x40));
    *puVar1 = *puVar1 | 1L << ((byte)uVar8 & 0x3f);
    return;
  }
  pTVar15 = (TCGv_vec)(a0 - (long)tcg_ctx);
  pTVar14 = (TCGv_vec)(in_R9 - (long)tcg_ctx);
  switch(opc) {
  case INDEX_op_shli_vec:
  case INDEX_op_shri_vec:
    pTVar6 = tcg_temp_new_internal_riscv32(tcg_ctx,type,false);
    pTVar14 = (TCGv_vec)((long)pTVar6 - (long)tcg_ctx);
    pTVar7 = tcg_temp_new_internal_riscv32(tcg_ctx,type,false);
    pTVar15 = (TCGv_vec)((long)pTVar7 - (long)tcg_ctx);
    uVar16 = ((long)(pTVar14 + -0x388) >> 3) * 0x6db6db6db6db6db7;
    vec_gen_3_riscv32(tcg_ctx,INDEX_op_x86_punpckl_vec,type,0,(TCGArg)pTVar6,in_R9,in_R9);
    uVar8 = ((long)(pTVar15 + -0x388) >> 3) * 0x6db6db6db6db6db7;
    vec_gen_3_riscv32(tcg_ctx,INDEX_op_x86_punpckh_vec,type,0,(TCGArg)pTVar7,in_R9,in_R9);
    i_00 = in_stack_00000008 + 8;
    if (opc != INDEX_op_shri_vec) {
      tcg_gen_shli_vec_riscv32(tcg_ctx,1,pTVar14,pTVar14,i_00);
      tcg_gen_shli_vec_riscv32(tcg_ctx,1,pTVar15,pTVar15,i_00);
      i_00 = 8;
    }
    tcg_gen_shri_vec_riscv32(tcg_ctx,1,pTVar14,pTVar14,i_00);
    tcg_gen_shri_vec_riscv32(tcg_ctx,1,pTVar15,pTVar15,i_00);
    vec_gen_3_riscv32(tcg_ctx,INDEX_op_x86_packus_vec,type,0,a0,(TCGArg)pTVar6,(TCGArg)pTVar7);
    uVar9 = *(ulong *)((long)tcg_ctx + (long)pTVar14);
    *(ulong *)((long)tcg_ctx + (long)pTVar14) = uVar9 & 0xffffff5fffffffff;
    puVar1 = (ulong *)((long)tcg_ctx->free_temps[0].l +
                      (uVar16 >> 6) * 8 +
                      (ulong)((((uint)(uVar9 >> 0x26) & 1) * 5 + ((uint)(uVar9 >> 0x10) & 0xff)) *
                             0x40));
    *puVar1 = *puVar1 | 1L << ((byte)uVar16 & 0x3f);
    uVar16 = *(ulong *)((long)tcg_ctx + (long)pTVar15);
    *(ulong *)((long)tcg_ctx + (long)pTVar15) = uVar16 & 0xffffff5fffffffff;
    puVar1 = (ulong *)((long)tcg_ctx->free_temps[0].l +
                      (uVar8 >> 6) * 8 +
                      (ulong)((((uint)(uVar16 >> 0x26) & 1) * 5 + ((uint)(uVar16 >> 0x10) & 0xff)) *
                             0x40));
    *puVar1 = *puVar1 | 1L << ((byte)uVar8 & 0x3f);
    break;
  case INDEX_op_sari_vec:
    if (vece != 3) {
      if (vece != 0) {
        line = 0xd3c;
        goto LAB_00c10c7a;
      }
      pTVar6 = tcg_temp_new_internal_riscv32(tcg_ctx,type,false);
      pTVar15 = (TCGv_vec)((long)pTVar6 - (long)tcg_ctx);
      pTVar7 = tcg_temp_new_internal_riscv32(tcg_ctx,type,false);
      pTVar14 = (TCGv_vec)((long)pTVar7 - (long)tcg_ctx);
      uVar8 = ((long)(pTVar15 + -0x388) >> 3) * 0x6db6db6db6db6db7;
      vec_gen_3_riscv32(tcg_ctx,INDEX_op_x86_punpckl_vec,type,0,(TCGArg)pTVar6,in_R9,in_R9);
      vec_gen_3_riscv32(tcg_ctx,INDEX_op_x86_punpckh_vec,type,0,(TCGArg)pTVar7,in_R9,in_R9);
      tcg_gen_sari_vec_riscv32(tcg_ctx,1,pTVar15,pTVar15,in_stack_00000008 + 8);
      tcg_gen_sari_vec_riscv32(tcg_ctx,1,pTVar14,pTVar14,in_stack_00000008 + 8);
      vec_gen_3_riscv32(tcg_ctx,INDEX_op_x86_packss_vec,type,0,a0,(TCGArg)pTVar6,(TCGArg)pTVar7);
      uVar16 = *(ulong *)pTVar6;
      *(ulong *)pTVar6 = uVar16 & 0xffffff5fffffffff;
      puVar1 = (ulong *)((long)tcg_ctx->free_temps[0].l +
                        (uVar8 >> 6) * 8 +
                        (ulong)((((uint)(uVar16 >> 0x26) & 1) * 5 + ((uint)(uVar16 >> 0x10) & 0xff))
                               * 0x40));
      *puVar1 = *puVar1 | 1L << ((byte)uVar8 & 0x3f);
      uVar16 = *(ulong *)pTVar7;
      *(ulong *)pTVar7 = uVar16 & 0xffffff5fffffffff;
      goto LAB_00c10c1f;
    }
    if (0x20 < in_stack_00000008) {
      pTVar13 = tcg_const_zeros_vec_riscv32(tcg_ctx,type);
      tcg_gen_cmp_vec_riscv32(tcg_ctx,TCG_COND_GT,3,pTVar13,pTVar13,pTVar14);
      tcg_gen_shri_vec_riscv32(tcg_ctx,3,pTVar15,pTVar14,in_stack_00000008);
      tcg_gen_shli_vec_riscv32(tcg_ctx,3,pTVar13,pTVar13,0x40 - in_stack_00000008);
      tcg_gen_or_vec_riscv32(tcg_ctx,3,pTVar15,pTVar15,pTVar13);
      uVar8 = ((long)(pTVar13 + -0x388) >> 3) * 0x6db6db6db6db6db7;
      uVar16 = *(ulong *)(pTVar13 + (long)&tcg_ctx->pool_cur);
      *(ulong *)(pTVar13 + (long)&tcg_ctx->pool_cur) = uVar16 & 0xffffff5fffffffff;
      puVar1 = (ulong *)((long)tcg_ctx->free_temps[0].l +
                        (uVar8 >> 6) * 8 +
                        (ulong)(((uint)((uVar16 & 0x4000000000) != 0) * 5 +
                                ((uint)(uVar16 >> 0x10) & 0xff)) * 0x40));
      *puVar1 = *puVar1 | 1L << ((byte)uVar8 & 0x3f);
      return;
    }
    pTVar6 = tcg_temp_new_internal_riscv32(tcg_ctx,type,false);
    pTVar13 = (TCGv_vec)((long)pTVar6 - (long)tcg_ctx);
    i = 0x1f;
    if (in_stack_00000008 < 0x1f) {
      i = in_stack_00000008;
    }
    tcg_gen_sari_vec_riscv32(tcg_ctx,2,pTVar13,pTVar14,i);
    tcg_gen_shri_vec_riscv32(tcg_ctx,3,pTVar15,pTVar14,in_stack_00000008);
    vec_gen_4_riscv32(tcg_ctx,INDEX_op_x86_blend_vec,type,2,a0,a0,(TCGArg)pTVar6,0xaa);
    uVar16 = *(ulong *)pTVar6;
    *(ulong *)pTVar6 = uVar16 & 0xffffff5fffffffff;
    uVar2 = (uint)(uVar16 >> 0x10);
    uVar5 = (uint)((uVar16 & 0x4000000000) != 0);
    goto LAB_00c10890;
  case INDEX_op_cmp_vec:
    _Var4 = expand_vec_cmp_noinv
                      (tcg_ctx,type,vece,pTVar15,pTVar14,
                       (TCGv_vec)(in_stack_00000008 - (long)tcg_ctx),TStack0000000000000010);
    if (_Var4) {
      tcg_gen_not_vec_riscv32(tcg_ctx,vece,pTVar15,pTVar15);
    }
    break;
  case INDEX_op_cmpsel_vec:
    pTVar6 = tcg_temp_new_internal_riscv32(tcg_ctx,type,false);
    pTVar13 = (TCGv_vec)((long)pTVar6 - (long)tcg_ctx);
    _Var4 = expand_vec_cmp_noinv
                      (tcg_ctx,type,vece,pTVar13,pTVar14,
                       (TCGv_vec)(in_stack_00000008 - (long)tcg_ctx),in_stack_00000020);
    lVar12 = _TStack0000000000000010 - (long)tcg_ctx;
    lVar3 = in_stack_00000018 - (long)tcg_ctx;
    if (_Var4) {
      lVar12 = in_stack_00000018 - (long)tcg_ctx;
      lVar3 = _TStack0000000000000010 - (long)tcg_ctx;
    }
    vec_gen_4_riscv32(tcg_ctx,INDEX_op_x86_vpblendvb_vec,type,vece,a0,
                      (long)&tcg_ctx->pool_cur + lVar3,(long)&tcg_ctx->pool_cur + lVar12,
                      (TCGArg)pTVar6);
    uVar16 = *(ulong *)pTVar6;
    *(ulong *)pTVar6 = uVar16 & 0xffffff5fffffffff;
    uVar2 = (uint)(uVar16 >> 0x10);
    uVar5 = (uint)(uVar16 >> 0x26) & 1;
LAB_00c10890:
    uVar16 = ((long)(pTVar13 + -0x388) >> 3) * 0x6db6db6db6db6db7;
    puVar1 = (ulong *)((long)tcg_ctx->free_temps[0].l +
                      (uVar16 >> 6) * 8 + (ulong)((uVar5 * 5 + (uVar2 & 0xff)) * 0x40));
    *puVar1 = *puVar1 | 1L << ((byte)uVar16 & 0x3f);
  }
  return;
}

Assistant:

void tcg_expand_vec_op(TCGContext *tcg_ctx, TCGOpcode opc, TCGType type, unsigned vece,
                       TCGArg a0, ...)
{
    va_list va;
    TCGArg a2;
    TCGv_vec v0, v1, v2, v3, v4;

    va_start(va, a0);
    v0 = temp_tcgv_vec(tcg_ctx, arg_temp(a0));
    v1 = temp_tcgv_vec(tcg_ctx, arg_temp(va_arg(va, TCGArg)));
    a2 = va_arg(va, TCGArg);

    switch (opc) {
    case INDEX_op_shli_vec:
    case INDEX_op_shri_vec:
        expand_vec_shi(tcg_ctx, type, vece, opc == INDEX_op_shri_vec, v0, v1, a2);
        break;

    case INDEX_op_sari_vec:
        expand_vec_sari(tcg_ctx, type, vece, v0, v1, a2);
        break;

    case INDEX_op_mul_vec:
        v2 = temp_tcgv_vec(tcg_ctx, arg_temp(a2));
        expand_vec_mul(tcg_ctx, type, vece, v0, v1, v2);
        break;

    case INDEX_op_cmp_vec:
        v2 = temp_tcgv_vec(tcg_ctx, arg_temp(a2));
        expand_vec_cmp(tcg_ctx, type, vece, v0, v1, v2, va_arg(va, TCGArg));
        break;

    case INDEX_op_cmpsel_vec:
        v2 = temp_tcgv_vec(tcg_ctx, arg_temp(a2));
        v3 = temp_tcgv_vec(tcg_ctx, arg_temp(va_arg(va, TCGArg)));
        v4 = temp_tcgv_vec(tcg_ctx, arg_temp(va_arg(va, TCGArg)));
        expand_vec_cmpsel(tcg_ctx, type, vece, v0, v1, v2, v3, v4, va_arg(va, TCGArg));
        break;

    default:
        break;
    }

    va_end(va);
}